

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O2

void __thiscall
icu_63::CollationRuleParser::CollationRuleParser
          (CollationRuleParser *this,CollationData *base,UErrorCode *errorCode)

{
  Normalizer2 *pNVar1;
  
  pNVar1 = Normalizer2::getNFDInstance(errorCode);
  this->nfd = pNVar1;
  pNVar1 = Normalizer2::getNFCInstance(errorCode);
  this->nfc = pNVar1;
  this->rules = (UnicodeString *)0x0;
  this->baseData = base;
  this->settings = (CollationSettings *)0x0;
  this->parseError = (UParseError *)0x0;
  this->errorReason = (char *)0x0;
  this->sink = (Sink *)0x0;
  *(undefined8 *)((long)&this->sink + 4) = 0;
  *(undefined8 *)((long)&this->importer + 4) = 0;
  return;
}

Assistant:

CollationRuleParser::CollationRuleParser(const CollationData *base, UErrorCode &errorCode)
        : nfd(*Normalizer2::getNFDInstance(errorCode)),
          nfc(*Normalizer2::getNFCInstance(errorCode)),
          rules(NULL), baseData(base), settings(NULL),
          parseError(NULL), errorReason(NULL),
          sink(NULL), importer(NULL),
          ruleIndex(0) {
}